

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

bool __thiscall
google::protobuf::anon_unknown_24::DescriptorsByNameEq<google::protobuf::Descriptor>::operator()
          (DescriptorsByNameEq<google::protobuf::Descriptor> *this,Descriptor *lhs,Descriptor *rhs)

{
  ushort uVar1;
  ushort uVar2;
  ushort *puVar3;
  int iVar4;
  ulong __n;
  
  if ((Descriptor *)this == lhs) {
    return true;
  }
  uVar1 = **(ushort **)(this + 0x10);
  __n = (ulong)uVar1;
  puVar3 = (ushort *)(lhs->all_names_).payload_;
  uVar2 = *puVar3;
  if (uVar1 == uVar2) {
    if (__n == 0) {
      return true;
    }
    iVar4 = bcmp((void *)((long)*(ushort **)(this + 0x10) + ~__n),
                 (void *)((long)puVar3 + ~(ulong)uVar2),__n);
    if (iVar4 == 0) {
      return true;
    }
  }
  return false;
}

Assistant:

bool operator()(const DescriptorT* lhs, const DescriptorT* rhs) const {
    return lhs == rhs || lhs->name() == rhs->name();
  }